

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  maze_s final;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  maze_s step;
  int local_16c;
  int i_1;
  vector<double,_std::allocator<double>_> local_140;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  local_128;
  undefined1 local_110 [8];
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> show_path;
  vector<double,_std::allocator<double>_> local_e0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  undefined1 local_b0 [8];
  maze_path get_path;
  HBF hbf;
  int local_38;
  int j;
  int i;
  undefined1 local_28 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  GRID;
  
  GRID.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  makeBlankGrid((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_28,0x10);
  poVar5 = std::operator<<((ostream *)&std::cout,"Finding path through grid:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_38 = 0;
  while( true ) {
    sVar6 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_28);
    if (sVar6 <= (ulong)(long)local_38) break;
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_28,(long)local_38);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,0);
    std::ostream::operator<<((ostream *)&std::cout,*pvVar8);
    hbf.LENGTH._4_4_ = 1;
    while( true ) {
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_28,0);
      sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
      if (sVar6 <= (ulong)(long)hbf.LENGTH._4_4_) break;
      poVar5 = std::operator<<((ostream *)&std::cout,",");
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_28,(long)local_38);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)hbf.LENGTH._4_4_);
      std::ostream::operator<<(poVar5,*pvVar8);
      hbf.LENGTH._4_4_ = hbf.LENGTH._4_4_ + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_38 = local_38 + 1;
  }
  HBF::HBF((HBF *)&get_path.final.theta);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_c8,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_28);
  std::vector<double,_std::allocator<double>_>::vector(&local_e0,&START);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&GOAL);
  HBF::search((maze_path *)local_b0,(HBF *)&get_path.final.theta,&local_c8,&local_e0,
              (vector<int,_std::allocator<int>_> *)
              &show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector(&local_e0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector(&local_128,
           (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
            *)&get_path.closed.
               super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector(&local_140,&START);
  final.x = get_path.final.g;
  final.g = (double)get_path.came_from.
                    super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
  final.y = get_path.final.x;
  final.theta = get_path.final.y;
  HBF::reconstruct_path
            ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_110,
             (HBF *)&get_path.final.theta,&local_128,&local_140,final);
  std::vector<double,_std::allocator<double>_>::~vector(&local_140);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector(&local_128);
  poVar5 = std::operator<<((ostream *)&std::cout,"steps: ");
  sVar6 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::size
                    ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_110);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"show path from start to finish");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  sVar6 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::size
                    ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_110);
  local_16c = (int)sVar6;
  while (local_16c = local_16c + -1, -1 < local_16c) {
    pvVar9 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::operator[]
                       ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_110,
                        (long)local_16c);
    dVar1 = pvVar9->g;
    dVar2 = pvVar9->x;
    dVar3 = pvVar9->y;
    dVar4 = pvVar9->theta;
    poVar5 = std::operator<<((ostream *)&std::cout,"##### step ");
    sVar6 = std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::size
                      ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_110);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6 - (long)local_16c);
    poVar5 = std::operator<<(poVar5," #####");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"g ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar1);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"x ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar2);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"y ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"theta ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  GRID.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~vector
            ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)local_110);
  HBF::maze_path::~maze_path((maze_path *)local_b0);
  HBF::~HBF((HBF *)&get_path.final.theta);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_28);
  return GRID.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {

    vector< vector<int> > GRID = makeBlankGrid(16);

    cout << "Finding path through grid:" << endl;

    // TODO:: Create an Empty Maze and try testing the number of expansions with it

    for (int i = 0; i < GRID.size(); i++) {
        cout << GRID[i][0];
        for (int j = 1; j < GRID[0].size(); j++) {
            cout << "," << GRID[i][j];
        }
        cout << endl;
    }

    HBF hbf = HBF();

//    vector<vector<double> > heuristic = hbf.heuristic_basic(GRID, START, GOAL);
//    vector<vector<double> > heuristic = hbf.heuristic_nhh_euclidean(GRID, GOAL);
//    vector<vector<double> > heuristic = hbf.heuristic_nhh_manhattan(GRID, GOAL);

/*    cout << "Check my heuristic function. " << endl;
    for (int i = 0; i < heuristic.size(); i++) {
        cout << heuristic[i][0];
        for (int j = 1; j < heuristic[0].size(); j++) {
            cout << "," << heuristic[i][j];
        }
        cout << endl;
    }*/

    HBF::maze_path get_path = hbf.search(GRID, START, GOAL);

    vector<HBF::maze_s> show_path = hbf.reconstruct_path(get_path.came_from, START, get_path.final);

    cout << "steps: " <<show_path.size() << endl;
    cout << "show path from start to finish" << endl;
    for (int i = show_path.size() - 1; i >= 0; i--) {

        HBF::maze_s step = show_path[i];
        cout << "##### step " << show_path.size()-i << " #####" << endl;
        cout << "g " << step.g << endl;
        cout << "x " << step.x << endl;
        cout << "y " << step.y << endl;
        cout << "theta " << step.theta << endl;

    }

    return 0;
}